

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

void __thiscall Liby::Buffer::prepend(Buffer *this,char *buf,off_t len)

{
  long lVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  Buffer local_40;
  
  if ((buf != (char *)0x0) && (0 < len)) {
    lVar1 = this->leftIndex_;
    if (len - lVar1 != 0 && lVar1 <= len) {
      if (this->rightIndex_ < lVar1) {
        __assert_fail("rightIndex_ >= leftIndex_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                      ,0x5a,"off_t Liby::Buffer::size() const");
      }
      uVar2 = (this->rightIndex_ - lVar1) + len;
      if (this->capacity_ < (long)uVar2) {
        local_40.leftIndex_ = 0;
        local_40.rightIndex_ = 0;
        uVar4 = 0xffffffffffffffff;
        if (-1 < (long)uVar2) {
          uVar4 = uVar2;
        }
        local_40.capacity_ = uVar2;
        local_40.buffer_ = (char *)operator_new__(uVar4);
        append(&local_40,this);
        pcVar3 = this->buffer_;
        this->buffer_ = local_40.buffer_;
        this->leftIndex_ = local_40.leftIndex_;
        this->rightIndex_ = local_40.rightIndex_;
        this->capacity_ = local_40.capacity_;
        if (pcVar3 != (char *)0x0) {
          operator_delete__(pcVar3);
        }
      }
      else {
        backward(this,len - lVar1);
      }
    }
    pcVar3 = data(this);
    memcpy(pcVar3 + -len,buf,len);
    this->leftIndex_ = this->leftIndex_ - len;
    return;
  }
  __assert_fail("buf && len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                ,0x8f,"void Liby::Buffer::prepend(const char *, off_t)");
}

Assistant:

void Buffer::prepend(const char *buf, off_t len) {
    assert(buf && len > 0);
    if (leftIndex_ >= len) {
        ;
    } else if (len + size() <= capacity_) {
        backward(len - leftIndex_);
    } else {
        Buffer nb(len + size());
        nb.append(*this);
        swap(nb);
    }
    safePreappend(buf, len);
}